

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util_test.cc
# Opt level: O2

void __thiscall
google::protobuf::util::DelimitedMessageUtilTest_FailsAtEndOfStream_Test::TestBody
          (DelimitedMessageUtilTest_FailsAtEndOfStream_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_3d8;
  bool clean_eof;
  AssertionResult gtest_ar__1;
  AssertHelper local_3b8;
  AssertionResult gtest_ar_;
  string full_output;
  IstreamInputStream zstream;
  stringstream partial_stream;
  ostream local_310 [376];
  stringstream full_stream;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&full_stream);
  std::__cxx11::stringstream::stringstream((stringstream *)&partial_stream);
  proto2_unittest::ForeignMessage::ForeignMessage((ForeignMessage *)&zstream);
  zstream.impl_.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream = (_func_int **)0x180000002a;
  zstream.copying_input_.input_._0_1_ = (byte)zstream.copying_input_.input_ | 3;
  gtest_ar_.success_ = SerializeDelimitedToOstream((MessageLite *)&zstream,local_188);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&full_output,(internal *)&gtest_ar_,
               (AssertionResult *)"SerializeDelimitedToOstream(message, &full_stream)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
               ,0x47,full_output._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    std::__cxx11::string::~string((string *)&full_output);
    if (gtest_ar__1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::__cxx11::stringbuf::str();
  gtest_ar__1._0_8_ = full_output._M_string_length;
  local_3d8.data_ = (AssertHelperData *)0x2;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_,"full_output.size()","size_t{2}",(unsigned_long *)&gtest_ar__1,
             (unsigned_long *)&local_3d8);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&gtest_ar__1);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar__1._0_4_ = 4;
    testing::internal::CmpHelperEQ<char,int>
              ((internal *)&gtest_ar_,"full_output[0]","4",full_output._M_dataplus._M_p,
               (int *)&gtest_ar__1);
    if (gtest_ar_.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      poVar2 = std::operator<<(local_310,*full_output._M_dataplus._M_p);
      poVar2 = std::operator<<(poVar2,full_output._M_dataplus._M_p[1]);
      std::operator<<(poVar2,full_output._M_dataplus._M_p[2]);
      std::__cxx11::string::~string((string *)&full_output);
      proto2_unittest::ForeignMessage::~ForeignMessage((ForeignMessage *)&zstream);
      io::IstreamInputStream::IstreamInputStream(&zstream,(istream *)&partial_stream,-1);
      proto2_unittest::ForeignMessage::ForeignMessage((ForeignMessage *)&full_output);
      clean_eof = true;
      bVar1 = ParseDelimitedFromZeroCopyStream
                        ((MessageLite *)&full_output,&zstream.super_ZeroCopyInputStream,&clean_eof);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = !bVar1;
      if (bVar1) {
        testing::Message::Message((Message *)&local_3d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                   (AssertionResult *)
                   "ParseDelimitedFromZeroCopyStream(&message, &zstream, &clean_eof)","true","false"
                   ,in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
                   ,0x57,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3d8);
        testing::internal::AssertHelper::~AssertHelper(&local_3b8);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if (local_3d8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_3d8.data_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      gtest_ar__1._0_8_ = CONCAT71(gtest_ar__1._1_7_,clean_eof) ^ 1;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (clean_eof != false) {
        testing::Message::Message((Message *)&local_3d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"clean_eof",
                   "true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
                   ,0x58,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3d8);
        testing::internal::AssertHelper::~AssertHelper(&local_3b8);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if (local_3d8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_3d8.data_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      proto2_unittest::ForeignMessage::~ForeignMessage((ForeignMessage *)&full_output);
      io::IstreamInputStream::~IstreamInputStream(&zstream);
      goto LAB_00901c1d;
    }
    testing::Message::Message((Message *)&gtest_ar__1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&gtest_ar__1);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_3d8);
  if (gtest_ar__1._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&full_output);
  proto2_unittest::ForeignMessage::~ForeignMessage((ForeignMessage *)&zstream);
LAB_00901c1d:
  std::__cxx11::stringstream::~stringstream((stringstream *)&partial_stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)&full_stream);
  return;
}

Assistant:

TEST(DelimitedMessageUtilTest, FailsAtEndOfStream) {
  std::stringstream full_stream;
  std::stringstream partial_stream;

  {
    proto2_unittest::ForeignMessage message;
    message.set_c(42);
    message.set_d(24);
    EXPECT_TRUE(SerializeDelimitedToOstream(message, &full_stream));

    std::string full_output = full_stream.str();
    ASSERT_GT(full_output.size(), size_t{2});
    ASSERT_EQ(full_output[0], 4);

    partial_stream << full_output[0] << full_output[1] << full_output[2];
  }

  {
    bool clean_eof;
    io::IstreamInputStream zstream(&partial_stream);

    proto2_unittest::ForeignMessage message;
    clean_eof = true;
    EXPECT_FALSE(ParseDelimitedFromZeroCopyStream(&message,
        &zstream, &clean_eof));
    EXPECT_FALSE(clean_eof);
  }
}